

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_hasNoOutputParameter_Test::testBody
          (TEST_MockExpectedCall_hasNoOutputParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_90;
  undefined1 local_80 [8];
  MockNamedValue foo;
  SimpleString local_20;
  TEST_MockExpectedCall_hasNoOutputParameter_Test *local_10;
  TEST_MockExpectedCall_hasNoOutputParameter_Test *this_local;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  local_10 = this;
  SimpleString::SimpleString(&local_20,"foo");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0xb])(pMVar1,&local_20,1);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_90,"foo");
  MockNamedValue::MockNamedValue((MockNamedValue *)local_80,&local_90);
  SimpleString::~SimpleString(&local_90);
  MockNamedValue::setValue((MockNamedValue *)local_80,1);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2d])(pMVar1,local_80);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)((byte)((byte)iVar2 ^ 1) & 1),"CHECK_FALSE",
             "call->hasOutputParameter(foo)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x2e1,pTVar4);
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_80);
  return;
}

Assistant:

TEST(MockExpectedCall, hasNoOutputParameter)
{
    call->withIntParameter("foo", (int)1);
    MockNamedValue foo("foo");
    foo.setValue((int)1);
    CHECK_FALSE(call->hasOutputParameter(foo));
}